

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O1

errr borg_keypress(keycode_t k)

{
  int16_t iVar1;
  errr eVar2;
  char *pcVar3;
  long lVar4;
  
  if (k == 0) {
    borg_note(" & Key * *BAD KEY * *");
    eVar2 = -1;
  }
  else {
    if (*borg_cfg != 0) {
      if (k - 0x20 < 0x5f) {
        pcVar3 = format("& Key <%c> (0x%02X)",k,k);
      }
      else {
        pcVar3 = format("& Key <0x%02X>",k);
      }
      borg_note(pcVar3);
    }
    iVar1 = borg_key_head;
    lVar4 = (long)borg_key_head;
    borg_key_head = borg_key_head + 1;
    borg_key_queue[lVar4] = k;
    if (iVar1 == 0x1fff) {
      borg_key_head = 0;
    }
    if (borg_key_head == borg_key_tail) {
      borg_active = false;
      pcVar3 = format("# Aborting (%s).","overflow");
      borg_note(pcVar3);
      borg_key_tail = borg_key_head;
      borg_queued_direction = 0;
    }
    eVar2 = 0;
    if (borg_key_tail == 0x2000) {
      borg_key_tail = 0;
    }
  }
  return eVar2;
}

Assistant:

errr borg_keypress(keycode_t k)
{
    /* Hack -- Refuse to enqueue "nul" */
    if (!k) {
        borg_note(" & Key * *BAD KEY * *");
        return (-1);
    }

    /* Hack -- note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (k >= 32 && k <= 126) {
            borg_note(format("& Key <%c> (0x%02X)", k, k));
        } else {
            borg_note(format("& Key <0x%02X>", k));
        }
    }

    /* Store the char, advance the queue */
    borg_key_queue[borg_key_head++] = k;

    /* Circular queue, handle wrap */
    if (borg_key_head == KEY_SIZE)
        borg_key_head = 0;

    /* Hack -- Catch overflow (forget oldest) */
    if (borg_key_head == borg_key_tail)
        borg_oops("overflow");

    /* Hack -- Overflow may induce circular queue */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Success */
    return (0);
}